

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O3

void __thiscall
MockMemoryReportFormatter::report_alloc_memory
          (MockMemoryReportFormatter *this,TestResult *result,TestMemoryAllocator *allocator,
          size_t param_3,char *param_4,char *param_5,size_t param_6)

{
  TestMemoryAllocator *allocator_00;
  int iVar1;
  TestMemoryAllocator *allocator_01;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  
  allocator_00 = previousNewAllocator;
  allocator_01 = getCurrentNewAllocator();
  setCurrentNewAllocator(allocator_00);
  SimpleString::SimpleString(&local_30,"formatter");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_40,"report_alloc_memory");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_40);
  SimpleString::SimpleString(&local_50,"result");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x80))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_50,result);
  SimpleString::SimpleString(&local_60,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_70,"allocator");
  (**(code **)(*plVar3 + 0x20))(plVar3,&local_60,&local_70,allocator);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  setCurrentNewAllocator(allocator_01);
  return;
}

Assistant:

virtual void report_alloc_memory(TestResult* result, TestMemoryAllocator* allocator, size_t, char* , const char* , size_t ) _override
    {
        TemporaryDefaultNewAllocator tempAlloc(previousNewAllocator);
        mock("formatter").actualCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", allocator);
    }